

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

bool __thiscall cvm::BasicValue::operator==(BasicValue *this,BasicValue *RHS)

{
  __type _Var1;
  bool bVar2;
  
  if (this->Type != RHS->Type) {
switchD_00110045_default:
    return false;
  }
  switch(this->Type) {
  case BoolType:
    bVar2 = (this->field_2).BoolVal == (RHS->field_2).BoolVal;
    break;
  case IntType:
    bVar2 = (this->field_2).IntVal == (RHS->field_2).IntVal;
    break;
  case DoubleType:
    return (bool)(-((RHS->field_2).DoubleVal == (this->field_2).DoubleVal) & 1);
  case StringType:
    _Var1 = std::operator==(&this->StrVal,&RHS->StrVal);
    return _Var1;
  case VoidType:
    return true;
  default:
    goto switchD_00110045_default;
  }
  return bVar2;
}

Assistant:

bool BasicValue::operator==(const BasicValue &RHS) const {
  if (Type != RHS.Type)
    return false;
  switch (Type) {
  case BoolType:
    return BoolVal == RHS.BoolVal;
  case IntType:
    return IntVal == RHS.IntVal;
  case DoubleType:
    return DoubleVal == RHS.DoubleVal;
  case StringType:
    return StrVal == RHS.StrVal;
  case VoidType:
    return true;
  default:
    return false;
  }
}